

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void help(void)

{
  fprintf(_stderr,
          "-d [directory] path for concatenation\n-o [filename] output concatenated file\n-M concatenate MPLT files\n-m concatenate MELT files\n-Q concatenate QPLT files\n-q concatenate QELT files\n-S concatenate SPLT files\n-s concatenate SELT files\n-h help\n-v version\n"
         );
  return;
}

Assistant:

void help() {

  fprintf(stderr,
	  "-d [directory] path for concatenation\n"
	  "-o [filename] output concatenated file\n"
	  "-M concatenate MPLT files\n"
	  "-m concatenate MELT files\n"
	  "-Q concatenate QPLT files\n"
	  "-q concatenate QELT files\n"
	  "-S concatenate SPLT files\n"
	  "-s concatenate SELT files\n"
	  "-h help\n"
	  "-v version\n"
  );

}